

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastRotateLeft(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,Vec_Int_t *vRes)

{
  int *piVar1;
  int iVar2;
  void *__ptr;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong local_60;
  
  vRes->nSize = 0;
  uVar5 = (ulong)(uint)nNum;
  if (0 < nNum) {
    uVar6 = 0;
    do {
      Vec_IntPush(vRes,pNum[uVar6]);
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  __ptr = malloc((long)nNum << 2);
  if (0x20 < nShift) {
    __assert_fail("nShift <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0xee,"void Wlc_BlastRotateLeft(Gia_Man_t *, int *, int, int *, int, Vec_Int_t *)"
                 );
  }
  if (0 < nShift) {
    local_60 = 0;
    do {
      if (nNum < 1) {
        vRes->nSize = 0;
      }
      else {
        piVar1 = vRes->pArray;
        iVar3 = 1 << ((byte)local_60 & 0x1f);
        uVar6 = 0;
        iVar4 = iVar3;
        do {
          if ((long)uVar6 < (long)iVar3) {
            iVar2 = nNum - iVar4 % nNum;
          }
          else {
            iVar2 = (int)uVar6 - iVar3;
          }
          iVar2 = Gia_ManHashMux(pNew,pShift[local_60],piVar1[iVar2 % nNum],piVar1[uVar6]);
          *(int *)((long)__ptr + uVar6 * 4) = iVar2;
          uVar6 = uVar6 + 1;
          iVar4 = iVar4 + -1;
        } while (uVar5 != uVar6);
        vRes->nSize = 0;
        if (0 < nNum) {
          uVar6 = 0;
          do {
            Vec_IntPush(vRes,*(int *)((long)__ptr + uVar6 * 4));
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
      }
      local_60 = local_60 + 1;
    } while (local_60 != (uint)nShift);
  }
  if (__ptr == (void *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Wlc_BlastRotateLeft( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, Vec_Int_t * vRes )
{
    int * pRes = Wlc_VecCopy( vRes, pNum, nNum );
    int i, j, * pTemp = ABC_ALLOC( int, nNum );
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++, pRes = Wlc_VecCopy(vRes, pTemp, nNum) ) 
        for( j = 0; j < nNum; j++ ) 
        {
            int move = (j >= (1<<i)) ? (j-(1<<i))%nNum : (nNum - (((1<<i)-j)%nNum)) % nNum;
            pTemp[j] = Gia_ManHashMux( pNew, pShift[i], pRes[move], pRes[j] );
//            pTemp[j] = Gia_ManHashMux( pNew, pShift[i], pRes[((unsigned)(nNum-(1<<i)+j))%nNum], pRes[j] );
        }
    ABC_FREE( pTemp );
}